

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

void __thiscall
duckdb::Logger::WriteLog(Logger *this,char *log_type,LogLevel log_level,string_t *message)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  string copied_string;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar2 = (ulong)(message->value).pointer.length;
  if (uVar2 < 0xd) {
    pcVar1 = (message->value).pointer.prefix;
  }
  else {
    pcVar1 = (message->value).pointer.ptr;
  }
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar1,pcVar1 + uVar2);
  (*this->_vptr_Logger[3])
            (this,log_type,CONCAT71(in_register_00000011,log_level) & 0xffffffff,local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

void Logger::WriteLog(const char *log_type, LogLevel log_level, const string_t &message) {
	string copied_string = message.GetString();
	WriteLog(log_type, log_level, copied_string.c_str());
}